

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O2

void __thiscall
cppcms::applications_pool::unmount
          (applications_pool *this,weak_ptr<cppcms::application_specific_pool> *wgen)

{
  _data *this_00;
  const_iterator __position;
  shared_ptr<cppcms::application_specific_pool> gen;
  unique_lock<std::recursive_mutex> lock;
  __shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> local_30;
  unique_lock<std::recursive_mutex> local_20;
  
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30);
  if (local_30._M_ptr != (element_type *)0x0) {
    std::unique_lock<std::recursive_mutex>::unique_lock(&local_20,&((this->d).ptr_)->lock);
    this_00 = (this->d).ptr_;
    __position._M_node = (_List_node_base *)this_00;
    do {
      __position._M_node =
           (((_data *)__position._M_node)->apps).
           super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      if ((_data *)__position._M_node == this_00) goto LAB_00209e4c;
    } while ((element_type *)__position._M_node[3]._M_prev != local_30._M_ptr);
    std::__cxx11::
    list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
    ::erase(&this_00->apps,__position);
LAB_00209e4c:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void applications_pool::unmount(booster::weak_ptr<application_specific_pool> wgen)
{
	booster::shared_ptr<application_specific_pool> gen = wgen.lock();
	if(!gen) return;
	
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);

	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen) {
			d->apps.erase(it);
			return;
		}
	}
}